

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStream::QTextStream(QTextStream *this,QByteArray *array,OpenMode openMode)

{
  QTextStreamPrivate *pQVar1;
  QBuffer *this_00;
  
  this->_vptr_QTextStream = (_func_int **)&PTR__QTextStream_00666738;
  pQVar1 = (QTextStreamPrivate *)operator_new(0x168);
  QTextStreamPrivate::QTextStreamPrivate(pQVar1,this);
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl = pQVar1;
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  QBuffer::setData(this_00,array);
  (*(this_00->super_QIODevice).super_QObject._vptr_QObject[0xd])
            (this_00,(ulong)(uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                  .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  pQVar1->device = (QIODevice *)this_00;
  pQVar1->deleteDevice = true;
  QDeviceClosedNotifier::setupDevice
            ((QDeviceClosedNotifier *)&pQVar1->deviceClosedNotifier,this,(QIODevice *)this_00);
  pQVar1->status = Ok;
  return;
}

Assistant:

QTextStream::QTextStream(const QByteArray &array, OpenMode openMode)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(const QByteArray &array == *(%p), openMode = %d)",
           &array, int(openMode.toInt()));
#endif
    QBuffer *buffer = new QBuffer;
    buffer->setData(array);
    buffer->open(openMode);

    Q_D(QTextStream);
    d->device = buffer;
    d->deleteDevice = true;
#ifndef QT_NO_QOBJECT
    d->deviceClosedNotifier.setupDevice(this, d->device);
#endif
    d->status = Ok;
}